

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visitor_tmpl_impl.hpp
# Opt level: O0

AVisitor<hiberlite::ExtractModel> * __thiscall
hiberlite::AVisitor<hiberlite::ExtractModel>::operator&
          (AVisitor<hiberlite::ExtractModel> *this,
          db_atom<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *atom)

{
  ExtractModel *this_00;
  db_atom<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_28
  ;
  db_atom<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_18;
  db_atom<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *atom_local;
  AVisitor<hiberlite::ExtractModel> *this_local;
  
  this_00 = this->actor;
  local_18 = atom;
  atom_local = (db_atom<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)this;
  db_atom<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::db_atom
            (&local_28,atom);
  ExtractModel::act<hiberlite::AVisitor<hiberlite::ExtractModel>,std::__cxx11::string>
            (this_00,this,&local_28);
  db_atom<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~db_atom(&local_28);
  return this;
}

Assistant:

AVisitor<C>& AVisitor<C>::operator&(db_atom<X> atom)
{
	actor->act(*this,atom);
	return *this;
}